

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_js_generator.cc
# Opt level: O2

void __thiscall
t_js_generator::generate_js_struct_writer(t_js_generator *this,ostream *out,t_struct *tstruct)

{
  int *piVar1;
  t_field *tfield;
  int iVar2;
  undefined4 extraout_var;
  ostream *poVar3;
  undefined4 extraout_var_00;
  t_js_generator *this_00;
  pointer pptVar4;
  string name;
  string local_c0;
  t_struct *local_a0;
  pointer local_98;
  string local_90;
  string local_70 [32];
  string local_50;
  
  local_a0 = tstruct;
  iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  std::__cxx11::string::string(local_70,(string *)CONCAT44(extraout_var,iVar2));
  if (this->gen_es6_ == true) {
    poVar3 = t_generator::indent((t_generator *)this,out);
    poVar3 = std::operator<<(poVar3,"write (output) {");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  }
  else {
    poVar3 = t_generator::indent((t_generator *)this,out);
    js_namespace_abi_cxx11_(&local_c0,this,(local_a0->super_t_type).program_);
    poVar3 = std::operator<<(poVar3,(string *)&local_c0);
    iVar2 = (*(local_a0->super_t_type).super_t_doc._vptr_t_doc[3])();
    poVar3 = std::operator<<(poVar3,(string *)CONCAT44(extraout_var_00,iVar2));
    poVar3 = std::operator<<(poVar3,".prototype.write = function(output) {");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_c0);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"output.writeStructBegin(\'");
  poVar3 = std::operator<<(poVar3,local_70);
  poVar3 = std::operator<<(poVar3,"\');");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  for (pptVar4 = (local_a0->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pptVar4 !=
      (local_a0->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar4 = pptVar4 + 1) {
    t_generator::indent_abi_cxx11_(&local_c0,(t_generator *)this);
    poVar3 = std::operator<<(out,(string *)&local_c0);
    poVar3 = std::operator<<(poVar3,"if (this.");
    poVar3 = std::operator<<(poVar3,(string *)&(*pptVar4)->name_);
    poVar3 = std::operator<<(poVar3," !== null && this.");
    poVar3 = std::operator<<(poVar3,(string *)&(*pptVar4)->name_);
    poVar3 = std::operator<<(poVar3," !== undefined) {");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_c0);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    poVar3 = t_generator::indent((t_generator *)this,out);
    poVar3 = std::operator<<(poVar3,"output.writeFieldBegin(");
    poVar3 = std::operator<<(poVar3,"\'");
    poVar3 = std::operator<<(poVar3,(string *)&(*pptVar4)->name_);
    this_00 = (t_js_generator *)0x2db95c;
    poVar3 = std::operator<<(poVar3,"\', ");
    type_to_enum_abi_cxx11_(&local_c0,this_00,(*pptVar4)->type_);
    poVar3 = std::operator<<(poVar3,(string *)&local_c0);
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(*pptVar4)->key_);
    poVar3 = std::operator<<(poVar3,");");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_c0);
    tfield = *pptVar4;
    local_98 = pptVar4;
    std::__cxx11::string::string((string *)&local_50,"this.",(allocator *)&local_c0);
    generate_serialize_field(this,out,tfield,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    poVar3 = t_generator::indent((t_generator *)this,out);
    pptVar4 = local_98;
    poVar3 = std::operator<<(poVar3,"output.writeFieldEnd();");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    poVar3 = t_generator::indent((t_generator *)this,out);
    poVar3 = std::operator<<(poVar3,"}");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  }
  t_generator::indent_abi_cxx11_(&local_c0,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&local_c0);
  poVar3 = std::operator<<(poVar3,"output.writeFieldStop();");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_90,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_90);
  poVar3 = std::operator<<(poVar3,"output.writeStructEnd();");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_c0);
  t_generator::indent_abi_cxx11_(&local_c0,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&local_c0);
  poVar3 = std::operator<<(poVar3,"return;");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_c0);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  if (this->gen_es6_ == true) {
    t_generator::indent_abi_cxx11_(&local_c0,(t_generator *)this);
    poVar3 = std::operator<<(out,(string *)&local_c0);
    poVar3 = std::operator<<(poVar3,"}");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  }
  else {
    t_generator::indent_abi_cxx11_(&local_c0,(t_generator *)this);
    poVar3 = std::operator<<(out,(string *)&local_c0);
    poVar3 = std::operator<<(poVar3,"};");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  }
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string(local_70);
  return;
}

Assistant:

void t_js_generator::generate_js_struct_writer(ostream& out, t_struct* tstruct) {
  string name = tstruct->get_name();
  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;

  if (gen_es6_) {
    indent(out) << "write (output) {" << endl;
  } else {
    indent(out) << js_namespace(tstruct->get_program()) << tstruct->get_name()
        << ".prototype.write = function(output) {" << endl;
  }

  indent_up();

  indent(out) << "output.writeStructBegin('" << name << "');" << endl;

  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    out << indent() << "if (this." << (*f_iter)->get_name() << " !== null && this."
        << (*f_iter)->get_name() << " !== undefined) {" << endl;
    indent_up();

    indent(out) << "output.writeFieldBegin("
                << "'" << (*f_iter)->get_name() << "', " << type_to_enum((*f_iter)->get_type())
                << ", " << (*f_iter)->get_key() << ");" << endl;

    // Write field contents
    generate_serialize_field(out, *f_iter, "this.");

    indent(out) << "output.writeFieldEnd();" << endl;

    indent_down();
    indent(out) << "}" << endl;
  }

  out << indent() << "output.writeFieldStop();" << endl << indent() << "output.writeStructEnd();"
      << endl;

  out << indent() << "return;" << endl;

  indent_down();
  if (gen_es6_) {
    out << indent() << "}" << endl << endl;
  } else {
    out << indent() << "};" << endl << endl;
  }
}